

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  size_t sVar2;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar3;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  NodeRef *pNVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  uint uVar21;
  Primitive_conflict4 *prim;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  undefined1 auVar29 [64];
  vint4 ai;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM3 [64];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_3;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai_2;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_1;
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_2;
  undefined1 auVar48 [64];
  Precalculations pre;
  ulong local_35b0;
  undefined1 local_35a8 [16];
  vbool<4> valid0;
  InstanceArrayIntersectorKMB<4> local_34e8 [16];
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  sVar18 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar18 != 8) {
    auVar26 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    auVar8 = vpcmpeqd_avx(auVar26,(undefined1  [16])valid_i->field_0);
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar27 = auVar8 & auVar7;
    if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar27[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar7,auVar8);
      auVar7 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar4.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar7,auVar8);
      fVar9 = *(float *)ray;
      fVar10 = *(float *)(ray + 4);
      fVar11 = *(float *)(ray + 8);
      fVar12 = *(float *)(ray + 0xc);
      auVar7 = *(undefined1 (*) [16])(ray + 0x10);
      auVar29 = ZEXT1664(CONCAT412(-auVar7._12_4_,
                                   CONCAT48(-auVar7._8_4_,auVar7._0_8_ ^ 0x8000000080000000)));
      local_35a8._4_4_ = auVar8._4_4_ ^ auVar26._4_4_;
      local_35a8._0_4_ = auVar8._0_4_ ^ auVar26._0_4_;
      local_35a8._8_4_ = auVar8._8_4_ ^ auVar26._8_4_;
      local_35a8._12_4_ = auVar8._12_4_ ^ auVar26._12_4_;
      auVar26 = *(undefined1 (*) [16])(ray + 0x20);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar18;
      stack_near[1].field_0 = aVar4;
      if (sVar18 != 0xfffffffffffffff8) {
        auVar43._8_4_ = 0x7fffffff;
        auVar43._0_8_ = 0x7fffffff7fffffff;
        auVar43._12_4_ = 0x7fffffff;
        auVar27 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar43);
        auVar46._8_4_ = 0x219392ef;
        auVar46._0_8_ = 0x219392ef219392ef;
        auVar46._12_4_ = 0x219392ef;
        auVar27 = vcmpps_avx(auVar27,auVar46,1);
        auVar5 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar46,auVar27);
        auVar27 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar43);
        auVar27 = vcmpps_avx(auVar27,auVar46,1);
        auVar6 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar46,auVar27);
        auVar27 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar43);
        auVar27 = vcmpps_avx(auVar27,auVar46,1);
        auVar27 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar46,auVar27);
        auVar43 = vrcpps_avx(auVar5);
        auVar35._8_4_ = 0x3f800000;
        auVar35._0_8_ = 0x3f8000003f800000;
        auVar35._12_4_ = 0x3f800000;
        auVar24 = vfnmadd213ps_fma(auVar5,auVar43,auVar35);
        auVar5 = vrcpps_avx(auVar6);
        auVar46 = vfnmadd213ps_fma(auVar6,auVar5,auVar35);
        auVar6 = vrcpps_avx(auVar27);
        auVar27 = vfnmadd213ps_fma(auVar27,auVar6,auVar35);
        auVar5 = vfmadd132ps_fma(auVar46,auVar5,auVar5);
        auVar43 = vfmadd132ps_fma(auVar24,auVar43,auVar43);
        auVar6 = vfmadd132ps_fma(auVar27,auVar6,auVar6);
        pNVar19 = stack_node + 1;
        auVar27 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
        auVar24._8_4_ = 0xff800000;
        auVar24._0_8_ = 0xff800000ff800000;
        auVar24._12_4_ = 0xff800000;
        auVar27 = vblendvps_avx(auVar24,auVar27,auVar8);
        auVar48 = ZEXT1664(auVar27);
        paVar20 = &stack_near[2].field_0;
LAB_005b8f9c:
        do {
          aVar28 = paVar20[-1];
          paVar20 = paVar20 + -1;
          auVar24 = auVar48._0_16_;
          auVar27 = vcmpps_avx((undefined1  [16])aVar28,auVar24,1);
          if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar27[0xf]) goto LAB_005b92c2;
          do {
            uVar21 = (uint)sVar18;
            if ((sVar18 & 8) != 0) {
              if (sVar18 == 0xfffffffffffffff8) goto LAB_005b92e3;
              auVar27 = vcmpps_avx(auVar24,(undefined1  [16])aVar28,6);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar27[0xf]) goto LAB_005b92c2;
              uVar16 = (ulong)(uVar21 & 0xf);
              auVar27 = vpcmpeqd_avx(auVar29._0_16_,auVar29._0_16_);
              auVar23 = local_35a8;
              if (uVar16 == 8) goto LAB_005b92a2;
              prim = (Primitive_conflict4 *)(sVar18 & 0xfffffffffffffff0);
              local_35b0 = 1;
              aVar3 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(local_35a8 ^ auVar27);
              goto LAB_005b922a;
            }
            uVar16 = sVar18 & 0xfffffffffffffff0;
            aVar25.i[2] = 0x7f800000;
            aVar25._0_8_ = 0x7f8000007f800000;
            aVar25.i[3] = 0x7f800000;
            lVar17 = -0x20;
            sVar18 = 8;
            do {
              sVar2 = *(size_t *)(uVar16 + 0x40 + lVar17 * 2);
              if (sVar2 == 8) {
                auVar29 = ZEXT1664((undefined1  [16])aVar25);
                break;
              }
              uVar1 = *(undefined4 *)(uVar16 + 0x120 + lVar17);
              auVar32._4_4_ = uVar1;
              auVar32._0_4_ = uVar1;
              auVar32._8_4_ = uVar1;
              auVar32._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar16 + 0x60 + lVar17);
              auVar30._4_4_ = uVar1;
              auVar30._0_4_ = uVar1;
              auVar30._8_4_ = uVar1;
              auVar30._12_4_ = uVar1;
              auVar27 = *(undefined1 (*) [16])(ray + 0x70);
              auVar46 = vfmadd231ps_fma(auVar30,auVar27,auVar32);
              uVar1 = *(undefined4 *)(uVar16 + 0x160 + lVar17);
              auVar36._4_4_ = uVar1;
              auVar36._0_4_ = uVar1;
              auVar36._8_4_ = uVar1;
              auVar36._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar16 + 0xa0 + lVar17);
              auVar33._4_4_ = uVar1;
              auVar33._0_4_ = uVar1;
              auVar33._8_4_ = uVar1;
              auVar33._12_4_ = uVar1;
              auVar35 = vfmadd231ps_fma(auVar33,auVar27,auVar36);
              uVar1 = *(undefined4 *)(uVar16 + 0x1a0 + lVar17);
              auVar39._4_4_ = uVar1;
              auVar39._0_4_ = uVar1;
              auVar39._8_4_ = uVar1;
              auVar39._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar16 + 0xe0 + lVar17);
              auVar37._4_4_ = uVar1;
              auVar37._0_4_ = uVar1;
              auVar37._8_4_ = uVar1;
              auVar37._12_4_ = uVar1;
              auVar32 = vfmadd231ps_fma(auVar37,auVar27,auVar39);
              uVar1 = *(undefined4 *)(uVar16 + 0x140 + lVar17);
              auVar40._4_4_ = uVar1;
              auVar40._0_4_ = uVar1;
              auVar40._8_4_ = uVar1;
              auVar40._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar16 + 0x80 + lVar17);
              auVar44._4_4_ = uVar1;
              auVar44._0_4_ = uVar1;
              auVar44._8_4_ = uVar1;
              auVar44._12_4_ = uVar1;
              auVar33 = vfmadd231ps_fma(auVar44,auVar27,auVar40);
              uVar1 = *(undefined4 *)(uVar16 + 0x180 + lVar17);
              auVar41._4_4_ = uVar1;
              auVar41._0_4_ = uVar1;
              auVar41._8_4_ = uVar1;
              auVar41._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar16 + 0xc0 + lVar17);
              auVar45._4_4_ = uVar1;
              auVar45._0_4_ = uVar1;
              auVar45._8_4_ = uVar1;
              auVar45._12_4_ = uVar1;
              auVar36 = vfmadd231ps_fma(auVar45,auVar27,auVar41);
              uVar1 = *(undefined4 *)(uVar16 + 0x1c0 + lVar17);
              auVar42._4_4_ = uVar1;
              auVar42._0_4_ = uVar1;
              auVar42._8_4_ = uVar1;
              auVar42._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar16 + 0x100 + lVar17);
              auVar47._4_4_ = uVar1;
              auVar47._0_4_ = uVar1;
              auVar47._8_4_ = uVar1;
              auVar47._12_4_ = uVar1;
              auVar37 = vfmadd231ps_fma(auVar47,auVar27,auVar42);
              auVar15._4_4_ = auVar43._4_4_ * -fVar10;
              auVar15._0_4_ = auVar43._0_4_ * -fVar9;
              auVar15._8_4_ = auVar43._8_4_ * -fVar11;
              auVar15._12_4_ = auVar43._12_4_ * -fVar12;
              auVar23 = vfmadd213ps_fma(auVar46,auVar43,auVar15);
              auVar14._4_4_ = auVar5._4_4_ * -auVar7._4_4_;
              auVar14._0_4_ = auVar5._0_4_ * -auVar7._0_4_;
              auVar14._8_4_ = auVar5._8_4_ * -auVar7._8_4_;
              auVar14._12_4_ = auVar5._12_4_ * -auVar7._12_4_;
              auVar30 = vfmadd213ps_fma(auVar35,auVar5,auVar14);
              auVar13._4_4_ = auVar6._4_4_ * -auVar26._4_4_;
              auVar13._0_4_ = auVar6._0_4_ * -auVar26._0_4_;
              auVar13._8_4_ = auVar6._8_4_ * -auVar26._8_4_;
              auVar13._12_4_ = auVar6._12_4_ * -auVar26._12_4_;
              auVar32 = vfmadd213ps_fma(auVar32,auVar6,auVar13);
              auVar33 = vfmadd213ps_fma(auVar33,auVar43,auVar15);
              auVar36 = vfmadd213ps_fma(auVar36,auVar5,auVar14);
              auVar37 = vfmadd213ps_fma(auVar37,auVar6,auVar13);
              auVar46 = vpminsd_avx(auVar23,auVar33);
              auVar35 = vpminsd_avx(auVar30,auVar36);
              auVar46 = vpmaxsd_avx(auVar46,auVar35);
              auVar35 = vpminsd_avx(auVar32,auVar37);
              auVar46 = vpmaxsd_avx(auVar46,auVar35);
              auVar35 = vpmaxsd_avx(auVar23,auVar33);
              auVar23 = vpmaxsd_avx(auVar30,auVar36);
              auVar23 = vpminsd_avx(auVar35,auVar23);
              auVar35 = vpmaxsd_avx(auVar32,auVar37);
              auVar35 = vpminsd_avx(auVar35,auVar24);
              auVar23 = vpminsd_avx(auVar23,auVar35);
              auVar35 = vpmaxsd_avx(auVar46,(undefined1  [16])aVar4);
              if ((uVar21 & 7) == 6) {
                auVar35 = vcmpps_avx(auVar35,auVar23,2);
                uVar1 = *(undefined4 *)(uVar16 + 0x1e0 + lVar17);
                auVar34._4_4_ = uVar1;
                auVar34._0_4_ = uVar1;
                auVar34._8_4_ = uVar1;
                auVar34._12_4_ = uVar1;
                auVar23 = vcmpps_avx(auVar34,auVar27,2);
                uVar1 = *(undefined4 *)(uVar16 + 0x200 + lVar17);
                auVar38._4_4_ = uVar1;
                auVar38._0_4_ = uVar1;
                auVar38._8_4_ = uVar1;
                auVar38._12_4_ = uVar1;
                auVar27 = vcmpps_avx(auVar27,auVar38,1);
                auVar27 = vandps_avx(auVar23,auVar27);
                auVar27 = vandps_avx(auVar27,auVar35);
              }
              else {
                auVar27 = vcmpps_avx(auVar35,auVar23,2);
              }
              auVar35 = vcmpps_avx(auVar24,(undefined1  [16])aVar28,6);
              auVar27 = vandps_avx(auVar27,auVar35);
              auVar27 = vpslld_avx(auVar27,0x1f);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar27[0xf]) {
                auVar29 = ZEXT1664((undefined1  [16])aVar25);
                sVar2 = sVar18;
              }
              else {
                auVar31._8_4_ = 0x7f800000;
                auVar31._0_8_ = 0x7f8000007f800000;
                auVar31._12_4_ = 0x7f800000;
                auVar27 = vblendvps_avx(auVar31,auVar46,auVar27);
                auVar29 = ZEXT1664(auVar27);
                if (sVar18 != 8) {
                  pNVar19->ptr = sVar18;
                  pNVar19 = pNVar19 + 1;
                  *paVar20 = aVar25;
                  paVar20 = paVar20 + 1;
                }
              }
              sVar18 = sVar2;
              aVar25 = auVar29._0_16_;
              lVar17 = lVar17 + 4;
            } while (lVar17 != 0);
            aVar28 = auVar29._0_16_;
          } while (sVar18 != 8);
          sVar18 = pNVar19[-1].ptr;
          pNVar19 = pNVar19 + -1;
        } while (sVar18 != 0xfffffffffffffff8);
      }
LAB_005b92e3:
      auVar7 = vpand_avx(auVar8,local_35a8);
      auVar26._8_4_ = 0xff800000;
      auVar26._0_8_ = 0xff800000ff800000;
      auVar26._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar26);
      *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar22 = uVar16 - 8 <= local_35b0;
    local_35b0 = local_35b0 + 1;
    if (bVar22) break;
LAB_005b922a:
    valid0.field_0 = aVar3;
    InstanceArrayIntersectorKMB<4>::occluded(local_34e8,&valid0,&pre,ray,context,prim);
    aVar3.v = (__m128)vandnps_avx((undefined1  [16])local_34e8,valid0.field_0);
    auVar27 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_34e8;
    if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar27[0xf])
    break;
  }
  auVar27 = vpcmpeqd_avx((undefined1  [16])valid0.field_0,(undefined1  [16])valid0.field_0);
  auVar23._0_4_ = aVar3.i[0] ^ auVar27._0_4_;
  auVar23._4_4_ = aVar3.i[1] ^ auVar27._4_4_;
  auVar23._8_4_ = aVar3.i[2] ^ auVar27._8_4_;
  auVar23._12_4_ = aVar3.i[3] ^ auVar27._12_4_;
LAB_005b92a2:
  auVar29 = ZEXT1664(auVar27);
  local_35a8 = vpor_avx(local_35a8,auVar23);
  auVar27 = auVar27 & ~local_35a8;
  if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar27[0xf])
  goto LAB_005b92e3;
  auVar27._8_4_ = 0xff800000;
  auVar27._0_8_ = 0xff800000ff800000;
  auVar27._12_4_ = 0xff800000;
  auVar27 = vblendvps_avx(auVar24,auVar27,local_35a8);
  auVar48 = ZEXT1664(auVar27);
LAB_005b92c2:
  sVar18 = pNVar19[-1].ptr;
  pNVar19 = pNVar19 + -1;
  if (sVar18 == 0xfffffffffffffff8) goto LAB_005b92e3;
  goto LAB_005b8f9c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }